

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::~Server(Server *this)

{
  Server *this_local;
  
  Terminate(this);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Server::~Server()
{
    Terminate();
}